

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t archive_mstring_copy_mbs(archive_mstring *aes,char *mbs)

{
  size_t len;
  char *mbs_local;
  archive_mstring *aes_local;
  
  if (mbs == (char *)0x0) {
    aes->aes_set = L'\0';
    aes_local._4_4_ = L'\0';
  }
  else {
    len = strlen(mbs);
    aes_local._4_4_ = archive_mstring_copy_mbs_len(aes,mbs,len);
  }
  return aes_local._4_4_;
}

Assistant:

int
archive_mstring_copy_mbs(struct archive_mstring *aes, const char *mbs)
{
	if (mbs == NULL) {
		aes->aes_set = 0;
		return (0);
	}
	return (archive_mstring_copy_mbs_len(aes, mbs, strlen(mbs)));
}